

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_SetAssetReissuanceTest1_Test::TestBody
          (ConfidentialTransactionContext_SetAssetReissuanceTest1_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  OutPoint local_8e0;
  AssertionResult gtest_ar;
  Amount local_8a8;
  IssuanceParameter local_898;
  BlindFactor blind_factor;
  Txid txid;
  BlindFactor entropy;
  IssuanceParameter param;
  IssuanceOutputParameter issue_output;
  ConfidentialTransactionContext tx;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  ElementsConfidentialAddress address;
  
  std::__cxx11::string::string
            ((string *)&issue_output,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,(allocator *)&address);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&tx_base,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
             ,(allocator *)&address);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&expect_tx,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,&tx_base);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e",
             (allocator *)&address);
  cfd::core::Txid::Txid(&txid,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  AVar2 = cfd::core::Amount::CreateByCoinAmount(7.0);
  local_8a8.amount_ = AVar2.amount_;
  local_8a8.ignore_check_ = AVar2.ignore_check_;
  std::__cxx11::string::string
            ((string *)&issue_output,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             (allocator *)&param);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&address,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",(allocator *)&param)
  ;
  cfd::core::BlindFactor::BlindFactor(&blind_factor,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",(allocator *)&param)
  ;
  cfd::core::BlindFactor::BlindFactor(&entropy,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(&issue_output);
  cfd::core::ElementsConfidentialAddress::operator=(&issue_output.confidential_address,&address);
  issue_output.amount.ignore_check_ = local_8a8.ignore_check_;
  issue_output.amount.amount_ = local_8a8.amount_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_8e0,&txid,2);
      cfd::ConfidentialTransactionContext::SetAssetReissuance
                (&local_898,&tx,&local_8e0,&local_8a8,&issue_output,&blind_factor,&entropy);
      cfd::core::IssuanceParameter::operator=(&param,&local_898);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_898);
      cfd::core::Txid::~Txid(&local_8e0.txid_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xf2,
               "Expected: (param = tx.SetAssetReissuance(OutPoint(txid, 2), amount, issue_output, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)&local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_898);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&local_898,(AbstractTransaction *)&tx)
  ;
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_8e0,(AbstractTransaction *)&expect_tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",
             (char *)local_898.entropy._vptr_BlindFactor,(char *)local_8e0.txid_._vptr_Txid);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_898);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_898);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xf3,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)&local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_898);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issue_output);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  cfd::core::BlindFactor::~BlindFactor(&entropy);
  cfd::core::BlindFactor::~BlindFactor(&blind_factor);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&address);
  cfd::core::Txid::~Txid(&txid);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&expect_tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetReissuanceTest1)
{
    ConfidentialTransactionContext tx_base(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
    ConfidentialTransactionContext expect_tx(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e");
    Amount amount = Amount::CreateByCoinAmount(7.0);
    ElementsConfidentialAddress address("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
    BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
    BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");

    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    issue_output.confidential_address = address;
    issue_output.amount = amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetReissuance(OutPoint(txid, 2), amount,
                                       issue_output, blind_factor, entropy)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}